

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::SharedDtor(NeuralNetworkClassifier *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->labelprobabilitylayername_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if ((this != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) &&
     (this->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    (*(this->updateparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ClassLabels(this);
    return;
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::SharedDtor() {
  labelprobabilitylayername_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete updateparams_;
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}